

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O1

int tok_scan_defsym(tokcxdef *ctx,char *p,int len)

{
  byte bVar1;
  ushort **ppuVar2;
  long lVar3;
  
  ppuVar2 = __ctype_b_loc();
  bVar1 = *p;
  if (((((*ppuVar2)[bVar1] >> 10 & 1) == 0) && (bVar1 != 0x5f)) && (bVar1 != 0x24)) {
    errlogf(ctx->tokcxerr,"TADS",0x12d);
  }
  else if (len != 0) {
    lVar3 = 0;
    while (((bVar1 = p[lVar3], ((*ppuVar2)[bVar1] & 0xc00) != 0 || (bVar1 == 0x5f)) ||
           (bVar1 == 0x24))) {
      lVar3 = lVar3 + 1;
      if (len == (int)lVar3) {
        return len;
      }
    }
    return (int)lVar3;
  }
  return 0;
}

Assistant:

static int tok_scan_defsym(tokcxdef *ctx, char *p, int len)
{
    int symlen;

    /* make sure it's a valid symbol */
    if (!(isalpha((uchar)*p) || *p == '_' || *p == '$'))
    {
        errlog(ctx->tokcxerr, ERR_REQSYM);
        return 0;
    }

    /* count characters as long as we have valid symbol characters */
    for (symlen = 0 ; len && TOKISSYM(*p) ; ++p, --len, ++symlen) ;
    return symlen;
}